

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::benchmarkStarting(ConsoleReporter *this,BenchmarkInfo *info)

{
  bool bVar1;
  undefined1 uVar2;
  pointer this_00;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *this_01;
  const_reference pvVar3;
  type pTVar4;
  TablePrinter *pTVar5;
  string line;
  iterator __end1;
  iterator __begin1;
  Column *__range1;
  bool firstLine;
  Column nameCol;
  TablePrinter *in_stack_fffffffffffffea8;
  type in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  Column *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffed0;
  iterator *in_stack_fffffffffffffef8;
  Column local_70 [2];
  
  lazyPrintWithoutClosingBenchmarkTable((ConsoleReporter *)in_stack_fffffffffffffeb0);
  clara::TextFlow::Column::Column(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  this_00 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::
            operator->((unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_> *
                       )0x1350ff);
  this_01 = TablePrinter::columnInfos(this_00);
  pvVar3 = clara::std::
           vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ::operator[](this_01,0);
  clara::TextFlow::Column::width(local_70,(long)(pvVar3->width + -2));
  clara::TextFlow::Column::Column
            ((Column *)in_stack_fffffffffffffeb0,(Column *)in_stack_fffffffffffffea8);
  clara::TextFlow::Column::~Column((Column *)0x13515a);
  bVar1 = true;
  clara::TextFlow::Column::begin((Column *)in_stack_fffffffffffffeb0);
  clara::TextFlow::Column::end(in_stack_fffffffffffffec0);
  while( true ) {
    uVar2 = clara::TextFlow::Column::iterator::operator!=
                      ((iterator *)in_stack_fffffffffffffeb0,(iterator *)in_stack_fffffffffffffea8);
    if (!(bool)uVar2) break;
    clara::TextFlow::Column::iterator::operator*[abi_cxx11_(in_stack_fffffffffffffef8);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      pTVar4 = clara::std::
               unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::operator*
                         ((unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                           *)in_stack_fffffffffffffeb0);
      pTVar5 = Catch::operator<<(pTVar4);
      pTVar5 = Catch::operator<<(pTVar5);
      Catch::operator<<(pTVar5);
    }
    in_stack_fffffffffffffeb0 =
         clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::
         operator*((unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_> *)
                   in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffea8 =
         Catch::operator<<(in_stack_fffffffffffffeb0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffea8);
    Catch::operator<<(in_stack_fffffffffffffea8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
    clara::TextFlow::Column::iterator::operator++
              ((iterator *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
  }
  clara::TextFlow::Column::~Column((Column *)0x1352f8);
  return;
}

Assistant:

void ConsoleReporter::benchmarkStarting(BenchmarkInfo const& info) {
    lazyPrintWithoutClosingBenchmarkTable();

    auto nameCol = Column( info.name ).width( static_cast<std::size_t>( m_tablePrinter->columnInfos()[0].width - 2 ) );

    bool firstLine = true;
    for (auto line : nameCol) {
        if (!firstLine)
            (*m_tablePrinter) << ColumnBreak() << ColumnBreak() << ColumnBreak();
        else
            firstLine = false;

        (*m_tablePrinter) << line << ColumnBreak();
    }
}